

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSampleShadingTests.cpp
# Opt level: O3

IterateResult __thiscall glcts::SampleShadingRenderCase::iterate(SampleShadingRenderCase *this)

{
  string *sampler;
  int *piVar1;
  float *pfVar2;
  uint *puVar3;
  ChannelOrder CVar4;
  ChannelType CVar5;
  TestLog *pTVar6;
  RenderContext *pRVar7;
  code *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  pointer puVar12;
  bool bVar13;
  int iVar14;
  deUint32 dVar15;
  int iVar16;
  undefined4 uVar17;
  int iVar18;
  undefined4 extraout_var;
  TestError *pTVar20;
  uint uVar21;
  char *pcVar22;
  ulong uVar23;
  undefined1 auVar24 [8];
  TestContext *this_00;
  SampleShadingRenderCase *this_01;
  int iVar25;
  long lVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  float position_1 [8];
  float position [8];
  GLint maxSamples;
  GLuint fbo;
  GLuint rbo;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> result;
  GLuint fboMs;
  GLuint tex;
  PixelBufferAccess pixels;
  TextureLevel results;
  undefined1 local_2f8 [8];
  pointer puStack_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  int local_2d0;
  string local_2c8;
  int local_2a8;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  value_type local_2a0;
  undefined4 local_280;
  undefined4 local_27c;
  undefined1 local_278 [8];
  pointer local_270;
  undefined1 local_268 [16];
  deUint32 local_258;
  undefined4 local_254;
  ulong local_250;
  deUint32 local_248;
  deUint32 local_244;
  undefined8 local_240;
  string local_238;
  string *local_218;
  string local_210;
  undefined4 local_1f0;
  undefined4 local_1ec;
  string *local_1e8;
  TestLog *local_1e0;
  undefined1 local_1d8 [8];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  int local_1b0;
  pointer local_1a8;
  pointer pbStack_1a0;
  int local_198;
  string *local_190;
  PrimitiveType local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  pointer pbStack_150;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [32];
  TextureFormat *local_108;
  ShaderProgram local_100;
  long lVar19;
  
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar19 = CONCAT44(extraout_var,iVar14);
  if ((this->m_glslVersion == GLSL_VERSION_310_ES) &&
     (bVar13 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_sample_shading")
     , !bVar13)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar22 = "GL_OES_sample_shading";
LAB_00bdbbc5:
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_NOT_SUPPORTED,pcVar22);
    return STOP;
  }
  if (((this->m_extension)._M_string_length != 0) &&
     (bVar13 = glu::ContextInfo::isExtensionSupported
                         (((this->super_TestCase).m_context)->m_contextInfo,
                          (this->m_extension)._M_dataplus._M_p), !bVar13)) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar22 = (this->m_extension)._M_dataplus._M_p;
    goto LAB_00bdbbc5;
  }
  this->m_pGLMinSampleShading = *(glMinSampleShadingFunc *)(lVar19 + 0xdc8);
  local_2a8 = 0;
  CVar4 = (this->m_texFormat).order;
  CVar5 = (this->m_texFormat).type;
  if ((CVar5 != HALF_FLOAT || CVar4 != RGBA) &&
      ((CVar4 != R && CVar4 != RG) && CVar4 != RGBA || CVar5 != FLOAT)) {
    uVar17 = 0x8d57;
    if (CVar5 == UNSIGNED_INT8) {
      uVar17 = 0x9110;
    }
    if (CVar5 == SIGNED_INT8) {
      uVar17 = 0x9110;
    }
    (**(code **)(lVar19 + 0x868))(uVar17,&local_2a8);
  }
  else {
    (**(code **)(lVar19 + 0x880))(0x9100,this->m_internalFormat,0x80a9,1,&local_2a8);
    if (local_2a8 == 0) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar22 = "Multisample is not supported on this format";
      goto LAB_00bdbbc5;
    }
  }
  iVar14 = 4;
  if (local_2a8 < 4) {
    iVar14 = local_2a8;
  }
  local_1e0 = pTVar6;
  (**(code **)(lVar19 + 0x6f8))(1,&local_1ec);
  (**(code **)(lVar19 + 0xb8))(0x9100,local_1ec);
  (**(code **)(lVar19 + 0x1390))(0x9100,iVar14,this->m_internalFormat,0x10,0x10);
  (**(code **)(lVar19 + 0x6d0))(1,&local_1f0);
  (**(code **)(lVar19 + 0x78))(0x8d40,local_1f0);
  (**(code **)(lVar19 + 0x6a0))(0x8d40,0x8ce0,0x9100,local_1ec,0);
  (**(code **)(lVar19 + 0x1a00))(0,0,0x10,0x10);
  (*this->m_pGLMinSampleShading)(this->m_sampleShading);
  (**(code **)(lVar19 + 0x5e0))(0x8c36);
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "${VERSION_DECL}\nin highp vec2 a_position;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main (void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n   v_color = a_color;\n}\n"
             ,"");
  sampler = &this->m_sampler;
  local_218 = &this->m_outType;
  specializeVersion((string *)local_2f8,&local_2c8,this->m_glslVersion,sampler,local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_278,(char *)local_2f8,(allocator<char> *)&local_27c);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "${VERSION_DECL}\nin highp vec4 v_color;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main (void)\n{\n   o_color = ${OUT_TYPE}(v_color.x, v_color.y, 0.0, 0.0);\n}\n"
             ,"");
  specializeVersion(&local_238,&local_210,this->m_glslVersion,sampler,local_218);
  local_1e8 = sampler;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,local_238._M_dataplus._M_p,(allocator<char> *)&local_280);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d8,0,0xac);
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,(value_type *)local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c0,&local_2a0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar7,(ProgramSources *)local_1d8);
  local_108 = &this->m_texFormat;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar26 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar26));
    lVar26 = lVar26 + -0x18;
  } while (lVar26 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = local_1e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278,local_268._0_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])&local_2e8) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(pTVar6,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar20,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
               ,0x135);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_2c8.field_2._M_allocated_capacity = 0xbf8000003f800000;
  local_2c8.field_2._8_8_ = 0x3f8000003f800000;
  local_2c8._M_dataplus._M_p = (pointer)0xbf800000bf800000;
  local_2c8._M_string_length = 0x3f800000bf800000;
  local_270 = (pointer)0x3f80000000000000;
  local_268._0_4_ = this->m_min;
  local_268._4_4_ = this->m_max;
  local_278 = (undefined1  [8])CONCAT44(local_268._0_4_,local_268._0_4_);
  local_268._8_8_ = 0x3f80000000000000;
  local_250 = 0x3f80000000000000;
  local_240 = 0x3f80000000000000;
  local_258 = local_268._4_4_;
  local_254 = local_268._0_4_;
  local_248 = local_268._4_4_;
  local_244 = local_268._4_4_;
  (**(code **)(lVar19 + 0x1680))(local_100.m_program.m_program);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"a_position","");
  local_2f8._0_4_ = 1;
  puVar12 = (pointer)((long)&local_2e8 + 8);
  puStack_2f0 = puVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_2f0,local_2a0._M_dataplus._M_p,
             local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
  local_2d0 = 0;
  local_1d8._0_4_ = local_2f8._0_4_;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,puStack_2f0,local_2e8._M_allocated_capacity + (long)puStack_2f0);
  local_1b0 = local_2d0;
  local_1a8 = (pointer)0x8;
  pbStack_1a0 = (pointer)0x400000002;
  local_198 = 0;
  local_190 = &local_2c8;
  if (puStack_2f0 != puVar12) {
    operator_delete(puStack_2f0,local_2e8._8_8_ + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"a_color","");
  local_2f8._0_4_ = 1;
  puStack_2f0 = puVar12;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&puStack_2f0,local_238._M_dataplus._M_p,
             local_238._M_dataplus._M_p + local_238._M_string_length);
  local_2d0 = 0;
  local_188 = local_2f8._0_4_;
  pbVar27 = &local_170;
  local_180[0] = pbVar27;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_180,puStack_2f0,local_2e8._M_allocated_capacity + (long)puStack_2f0);
  local_170.field_2._M_allocated_capacity._0_4_ = local_2d0;
  local_170.field_2._8_8_ = (pointer)0x8;
  pbStack_150 = (pointer)0x400000004;
  local_148.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_148.
  super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_278;
  if (puStack_2f0 != puVar12) {
    operator_delete(puStack_2f0,local_2e8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  local_2f8 = (undefined1  [8])&DAT_600000001;
  puStack_2f0 = (pointer)CONCAT44(puStack_2f0._4_4_,1);
  local_2e8._M_allocated_capacity = (size_type)iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,2,
            (VertexArrayBinding *)local_1d8,(PrimitiveList *)local_2f8,(DrawUtilCallback *)0x0);
  dVar15 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar15,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                  ,0x147);
  lVar26 = -0xa0;
  do {
    if (pbVar27 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        pbVar27[-1].field_2._M_allocated_capacity) {
      operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      pbVar27[-1].field_2._M_allocated_capacity,
                      (ulong)((pbVar27->_M_dataplus)._M_p + 1));
    }
    pbVar27 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pbVar27[-3].field_2;
    lVar26 = lVar26 + 0x50;
  } while (lVar26 != 0);
  glu::ShaderProgram::~ShaderProgram(&local_100);
  (*this->m_pGLMinSampleShading)(0.0);
  (**(code **)(lVar19 + 0x4e8))(0x8c36);
  pcVar8 = *(code **)(lVar19 + 0x78);
  iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar8)(0x8d40,iVar16);
  (**(code **)(lVar19 + 0x440))(1,&local_1f0);
  iVar16 = iVar14 << 4;
  (**(code **)(lVar19 + 0x6e8))(1,&local_27c);
  (**(code **)(lVar19 + 0xa0))(0x8d41,local_27c);
  (**(code **)(lVar19 + 0x1238))(0x8d41,this->m_internalFormat,iVar16,0x10);
  (**(code **)(lVar19 + 0x6d0))(1,&local_280);
  (**(code **)(lVar19 + 0x78))(0x8d40,local_280);
  (**(code **)(lVar19 + 0x688))(0x8d40,0x8ce0,0x8d41,local_27c);
  (**(code **)(lVar19 + 0x1a00))(0,0,iVar16,0x10);
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "${VERSION_DECL}\nin highp vec2 a_position;\nvoid main(void)\n{\n   gl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  specializeVersion((string *)local_2f8,&local_2c8,this->m_glslVersion,local_1e8,local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_278,(char *)local_2f8,&local_2a1);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "${VERSION_DECL}\nuniform highp ${SAMPLER} u_tex;\nuniform int u_samples;\nlayout(location = 0) out highp ${OUT_TYPE} o_color;\nvoid main(void)\n{\n   ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n   int sampleId = int(gl_FragCoord.x) % u_samples;\n   o_color = texelFetch(u_tex, coord, sampleId);\n}\n"
             ,"");
  specializeVersion(&local_238,&local_210,this->m_glslVersion,local_1e8,local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,local_238._M_dataplus._M_p,&local_2a2);
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d8,0,0xac);
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d8,(value_type *)local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1c0,&local_2a0);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar7,(ProgramSources *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar26 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d8 + lVar26));
    lVar26 = lVar26 + -0x18;
  } while (lVar26 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  pTVar6 = local_1e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_278 != (undefined1  [8])local_268) {
    operator_delete((void *)local_278,local_268._0_8_ + 1);
  }
  if (local_2f8 != (undefined1  [8])&local_2e8) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(pTVar6,&local_100);
  if (local_100.m_program.m_info.linkOk == false) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar20,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
               ,0x175);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_2e8._M_allocated_capacity = 0xbf8000003f800000;
  local_2e8._8_8_ = 0x3f8000003f800000;
  local_2f8 = (undefined1  [8])0xbf800000bf800000;
  puStack_2f0 = (pointer)0x3f800000bf800000;
  (**(code **)(lVar19 + 0x1680))(local_100.m_program.m_program);
  pcVar8 = *(code **)(lVar19 + 0x14f0);
  uVar17 = (**(code **)(lVar19 + 0xb48))(local_100.m_program.m_program,"u_samples");
  (*pcVar8)(uVar17,iVar14);
  pcVar8 = *(code **)(lVar19 + 0x14f0);
  uVar17 = (**(code **)(lVar19 + 0xb48))(local_100.m_program.m_program,"u_tex");
  (*pcVar8)(uVar17,0);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"a_position","");
  local_278._0_4_ = 1;
  local_270 = (pointer)(local_268 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,local_2c8._M_dataplus._M_p,
             local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
  local_250 = local_250 & 0xffffffff00000000;
  local_1d8._0_4_ = local_278._0_4_;
  local_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,local_270,
             (undefined1 *)((long)local_270->m_data + local_268._0_8_));
  local_1b0 = (int)local_250;
  local_1a8 = (pointer)0x8;
  pbStack_1a0 = (pointer)0x400000002;
  local_198 = 0;
  local_190 = (string *)local_2f8;
  if (local_270 != (pointer)(local_268 + 8)) {
    operator_delete(local_270,local_268._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  local_278 = (undefined1  [8])&DAT_600000001;
  local_270 = (pointer)CONCAT44(local_270._4_4_,1);
  local_268._0_8_ = iterate::quadIndices;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
            (VertexArrayBinding *)local_1d8,(PrimitiveList *)local_278,(DrawUtilCallback *)0x0);
  dVar15 = (**(code **)(lVar19 + 0x800))();
  glu::checkError(dVar15,"Draw quad",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSampleShadingTests.cpp"
                  ,0x186);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
  }
  glu::ShaderProgram::~ShaderProgram(&local_100);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&local_100,local_108,iVar16,0x10,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1d8,(TextureLevel *)&local_100);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_278,
             (long)((int)local_1d0._M_p * local_1d0._M_p._4_4_),(allocator_type *)local_2f8);
  if (local_1d8._4_4_ == UNSIGNED_INT8) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8,
               (long)(local_1d0._M_p._4_4_ * (int)local_1d0._M_p * 4),(allocator_type *)&local_2c8);
    auVar24 = (undefined1  [8])0x0;
    (**(code **)(lVar19 + 0x1220))
              (0,0,(ulong)local_1d0._M_p & 0xffffffff,local_1d0._M_p._4_4_,0x8d99,0x1405,local_2f8);
    if ((undefined1  [8])puStack_2f0 != local_2f8) {
      uVar21 = 4;
      uVar23 = 0;
      do {
        puVar3 = (uint *)((long)local_2f8 + uVar23 * 4);
        uVar9 = puVar3[1];
        uVar10 = puVar3[2];
        uVar11 = puVar3[3];
        pfVar2 = (float *)((long)local_278 + (ulong)(uVar21 - 4 >> 2) * 0x10);
        *pfVar2 = ((float)(*puVar3 >> 0x10 | 0x53000000) - 5.497642e+11) +
                  (float)(*puVar3 & 0xffff | 0x4b000000);
        pfVar2[1] = ((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar9 & 0xffff | 0x4b000000);
        pfVar2[2] = ((float)(uVar10 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar10 & 0xffff | 0x4b000000);
        pfVar2[3] = ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) +
                    (float)(uVar11 & 0xffff | 0x4b000000);
        uVar23 = (ulong)uVar21;
        uVar21 = uVar21 + 4;
        auVar24 = local_278;
      } while (uVar23 < (ulong)((long)puStack_2f0 - (long)local_2f8 >> 2));
    }
    iVar16 = countUniquePixels((SampleShadingRenderCase *)auVar24,
                               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)local_278);
  }
  else {
    if (local_1d8._4_4_ != SIGNED_INT8) {
      this_01 = (SampleShadingRenderCase *)((this->super_TestCase).m_context)->m_renderCtx;
      glu::readPixels((RenderContext *)this_01,0,0,(PixelBufferAccess *)local_1d8);
      iVar16 = countUniquePixels(this_01,(ConstPixelBufferAccess *)local_1d8);
      goto LAB_00bdbcfb;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_2f8,
               (long)(local_1d0._M_p._4_4_ * (int)local_1d0._M_p * 4),(allocator_type *)&local_2c8);
    auVar24 = (undefined1  [8])0x0;
    (**(code **)(lVar19 + 0x1220))
              (0,0,(ulong)local_1d0._M_p & 0xffffffff,local_1d0._M_p._4_4_,0x8d99,0x1404,local_2f8);
    if ((undefined1  [8])puStack_2f0 != local_2f8) {
      uVar21 = 4;
      uVar23 = 0;
      do {
        piVar1 = (int *)((long)local_2f8 + uVar23 * 4);
        iVar16 = piVar1[1];
        iVar18 = piVar1[2];
        iVar25 = piVar1[3];
        pfVar2 = (float *)((long)local_278 + (ulong)(uVar21 - 4 >> 2) * 0x10);
        *pfVar2 = (float)*piVar1;
        pfVar2[1] = (float)iVar16;
        pfVar2[2] = (float)iVar18;
        pfVar2[3] = (float)iVar25;
        uVar23 = (ulong)uVar21;
        uVar21 = uVar21 + 4;
        auVar24 = local_278;
      } while (uVar23 < (ulong)((long)puStack_2f0 - (long)local_2f8 >> 2));
    }
    iVar16 = countUniquePixels((SampleShadingRenderCase *)auVar24,
                               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)local_278);
  }
  if (local_2f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2f8,local_2e8._M_allocated_capacity - (long)local_2f8);
  }
LAB_00bdbcfb:
  iVar18 = (int)((float)iVar14 * this->m_sampleShading);
  if (iVar18 < iVar14) {
    iVar14 = iVar18;
  }
  iVar25 = 0x100;
  if (0 < iVar18) {
    iVar25 = iVar14 << 8;
  }
  pcVar8 = *(code **)(lVar19 + 0x78);
  iVar14 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
  (*pcVar8)(0x8d40,iVar14);
  (**(code **)(lVar19 + 0x440))(1,&local_280);
  (**(code **)(lVar19 + 0xa0))(0x8d41,0);
  (**(code **)(lVar19 + 0x460))(1,&local_27c);
  (**(code **)(lVar19 + 0xb8))(0x9100,0);
  (**(code **)(lVar19 + 0x480))(1,&local_1ec);
  pcVar22 = "Pass";
  if (iVar16 < iVar25) {
    pcVar22 = "Fail";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(iVar16 < iVar25),
             pcVar22);
  if (local_278 != (undefined1  [8])0x0) {
    operator_delete((void *)local_278,local_268._0_8_ - (long)local_278);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&local_100);
  return STOP;
}

Assistant:

SampleShadingRenderCase::IterateResult SampleShadingRenderCase::iterate()
{
	TestLog&			  log  = m_testCtx.getLog();
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_shading"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_shading");
		return STOP;
	}
	if (!m_extension.empty() && !m_context.getContextInfo().isExtensionSupported(m_extension.c_str()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, m_extension.c_str());
		return STOP;
	}

	m_pGLMinSampleShading = gl.minSampleShading;

	GLint maxSamples = 0;
	if (((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::RG)) ||
		((m_texFormat.type == tcu::TextureFormat::FLOAT) && (m_texFormat.order == tcu::TextureFormat::R)) ||
		((m_texFormat.type == tcu::TextureFormat::HALF_FLOAT) && (m_texFormat.order == tcu::TextureFormat::RGBA)))
	{
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, m_internalFormat, GL_SAMPLES, 1, &maxSamples);
		if (maxSamples == 0)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Multisample is not supported on this format");
			return STOP;
		}
	}
	else if (m_texFormat.type == tcu::TextureFormat::SIGNED_INT8 ||
			 m_texFormat.type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &maxSamples);
	}
	else
	{
		gl.getIntegerv(GL_MAX_SAMPLES, &maxSamples);
	}
	GLint samples = de::min<GLint>(maxSamples, MAX_SAMPLES);

	GLuint tex;
	gl.genTextures(1, &tex);
	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, tex);
	gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, m_internalFormat, WIDTH, HEIGHT, GL_FALSE);

	GLuint fboMs;
	gl.genFramebuffers(1, &fboMs);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fboMs);
	gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D_MULTISAMPLE, tex, 0);
	gl.viewport(0, 0, WIDTH, HEIGHT);

	m_pGLMinSampleShading(m_sampleShading);
	gl.enable(GL_SAMPLE_SHADING_OES);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "in highp vec4 a_color;\n"
								 "out highp vec4 v_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "   v_color = a_color;\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "in highp vec4 v_color;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main (void)\n"
								 "{\n"
								 "   o_color = ${OUT_TYPE}(v_color.x, v_color.y, 0.0, 0.0);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		const float position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};
		const float color[] = {
			m_min, m_min, 0.0f, 1.0f, m_min, m_max, 0.0f, 1.0f, m_max, m_min, 0.0f, 1.0f, m_max, m_max, 0.0f, 1.0f,
		};

		gl.useProgram(program.getProgram());

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]), glu::va::Float("a_color", 4, 4, 0, &color[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}
	m_pGLMinSampleShading(0.0f);
	gl.disable(GL_SAMPLE_SHADING_OES);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fboMs);

	GLsizei width = WIDTH * samples;

	GLuint rbo;
	gl.genRenderbuffers(1, &rbo);
	gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
	gl.renderbufferStorage(GL_RENDERBUFFER, m_internalFormat, width, HEIGHT);

	GLuint fbo;
	gl.genFramebuffers(1, &fbo);
	gl.bindFramebuffer(GL_FRAMEBUFFER, fbo);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
	gl.viewport(0, 0, width, HEIGHT);

	{
		static char const* vss = "${VERSION_DECL}\n"
								 "in highp vec2 a_position;\n"
								 "void main(void)\n"
								 "{\n"
								 "   gl_Position = vec4(a_position, 0.0, 1.0);\n"
								 "}\n";

		static char const* fss = "${VERSION_DECL}\n"
								 "uniform highp ${SAMPLER} u_tex;\n"
								 "uniform int u_samples;\n"
								 "layout(location = 0) out highp ${OUT_TYPE} o_color;\n"
								 "void main(void)\n"
								 "{\n"
								 "   ivec2 coord = ivec2(int(gl_FragCoord.x) / u_samples, gl_FragCoord.y);\n"
								 "   int sampleId = int(gl_FragCoord.x) % u_samples;\n"
								 "   o_color = texelFetch(u_tex, coord, sampleId);\n"
								 "}\n";

		glu::ShaderProgram program(
			m_context.getRenderContext(),
			glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion, m_sampler, m_outType).c_str(),
									specializeVersion(fss, m_glslVersion, m_sampler, m_outType).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}

		float const position[] = {
			-1.0f, -1.0f, -1.0f, +1.0f, +1.0f, -1.0f, +1.0f, +1.0f,
		};

		gl.useProgram(program.getProgram());
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_samples"), samples);
		gl.uniform1i(gl.getUniformLocation(program.getProgram(), "u_tex"), 0);

		glu::VertexArrayBinding vertexArrays[] = {
			glu::va::Float("a_position", 2, 4, 0, &position[0]),
		};
		glu::draw(m_context.getRenderContext(), program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays),
				  &vertexArrays[0], glu::pr::TriangleStrip(DE_LENGTH_OF_ARRAY(quadIndices), &quadIndices[0]));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw quad");
	}

	tcu::TextureLevel	  results(m_texFormat, width, HEIGHT);
	tcu::PixelBufferAccess pixels = results.getAccess();
	std::vector<tcu::Vec4> result(pixels.getHeight() * pixels.getWidth());
	int					   uniquePixels;

	if (pixels.getFormat().type == tcu::TextureFormat::SIGNED_INT8)
	{
		std::vector<GLint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else if (pixels.getFormat().type == tcu::TextureFormat::UNSIGNED_INT8)
	{
		std::vector<GLuint> data(pixels.getHeight() * pixels.getWidth() * 4);
		gl.readPixels(0, 0, pixels.getWidth(), pixels.getHeight(), GL_RGBA_INTEGER, GL_UNSIGNED_INT, &data[0]);
		for (unsigned int i = 0; i < data.size(); i += 4)
		{
			result[i / 4] =
				tcu::Vec4((GLfloat)data[i], (GLfloat)data[i + 1], (GLfloat)data[i + 2], (GLfloat)data[i + 3]);
		}
		uniquePixels = countUniquePixels(result);
	}
	else
	{
		glu::readPixels(m_context.getRenderContext(), 0, 0, pixels);
		uniquePixels = countUniquePixels(pixels);
	}
	int expectedUnique = WIDTH * HEIGHT * (de::clamp(int(float(samples) * m_sampleShading), 1, samples));
	if (uniquePixels < expectedUnique)
	{
		isOk = false;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());
	gl.deleteFramebuffers(1, &fbo);

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	gl.deleteRenderbuffers(1, &rbo);

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, 0);
	gl.deleteTextures(1, &tex);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}